

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_projection(void)

{
  int local_c;
  wchar_t idx;
  
  for (local_c = 0; local_c < (int)(uint)z_info->projection_max; local_c = local_c + 1) {
    string_free(projections[local_c].name);
    string_free(projections[local_c].type);
    string_free(projections[local_c].desc);
    string_free(projections[local_c].lash_desc);
    string_free(projections[local_c].player_desc);
    string_free(projections[local_c].blind_desc);
  }
  mem_free(projections);
  return;
}

Assistant:

static void cleanup_projection(void)
{
	int idx;
	for (idx = 0; idx < z_info->projection_max; idx++) {
		string_free(projections[idx].name);
		string_free(projections[idx].type);
		string_free(projections[idx].desc);
		string_free(projections[idx].lash_desc);
		string_free(projections[idx].player_desc);
		string_free(projections[idx].blind_desc);
	}
	mem_free(projections);
}